

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::draw_image_mono
          (Fl_PostScript_Graphics_Driver *this,uchar *data,int ix,int iy,int iw,int ih,int D,int LD)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uchar b;
  void *data_00;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  uint a;
  uint a2;
  uchar r;
  uchar *curdata;
  void *big;
  uchar *curmask;
  char *pcStack_60;
  int bg;
  char *interpol;
  int local_50;
  int k;
  int j;
  int i;
  double h;
  double w;
  double y;
  double x;
  int ih_local;
  int iw_local;
  int iy_local;
  int ix_local;
  uchar *data_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  dVar4 = (double)ix;
  dVar5 = (double)iy;
  dVar6 = (double)iw;
  dVar7 = (double)ih;
  fprintf((FILE *)this->output,"save\n");
  if (this->lang_level_ < 2) {
    fprintf((FILE *)this->output,"%g %g %g %g %i %i GI",dVar4,dVar5 + dVar7,dVar6,-dVar7,
            (ulong)(uint)iw,(ulong)(uint)ih);
  }
  else {
    if (this->interpolate_ == 0) {
      pcStack_60 = "false";
    }
    else {
      pcStack_60 = "true";
    }
    if ((this->mask == (uchar *)0x0) || (this->lang_level_ < 3)) {
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %s GII\n",dVar4,dVar5 + dVar7,dVar6,-dVar7,
              (ulong)(uint)iw,(ulong)(uint)ih,pcStack_60);
    }
    else {
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %i %i %s GIM\n",dVar4,dVar5 + dVar7,dVar6,
              -dVar7,(ulong)(uint)iw,(ulong)(uint)ih,(ulong)(uint)this->mx,(ulong)(uint)this->my,
              pcStack_60);
    }
  }
  if (LD == 0) {
    LD = iw * D;
  }
  bVar1 = this->bg_r;
  bVar2 = this->bg_g;
  bVar3 = this->bg_b;
  big = this->mask;
  data_00 = prepare_rle85(this);
  for (local_50 = 0; local_50 < ih; local_50 = local_50 + 1) {
    if (this->mask != (uchar *)0x0) {
      for (interpol._4_4_ = 0; interpol._4_4_ < this->my / ih; interpol._4_4_ = interpol._4_4_ + 1)
      {
        for (k = 0; k < (this->mx + 7) / 8; k = k + 1) {
          b = swap_byte(*big);
          write_rle85(this,b,data_00);
          big = (void *)((long)big + 1);
        }
      }
    }
    _a2 = data + local_50 * LD;
    for (k = 0; k < iw; k = k + 1) {
      a._3_1_ = *_a2;
      if ((this->lang_level_ < 3) && (1 < D)) {
        a._3_1_ = (byte)((ulong)((uint)_a2[1] * (uint)a._3_1_ +
                                (((uint)bVar1 + (uint)bVar2 + (uint)bVar3) / 3) *
                                (0xff - (uint)_a2[1])) / 0xff);
      }
      write_rle85(this,a._3_1_,data_00);
      _a2 = _a2 + D;
    }
  }
  close_rle85(this,data_00);
  fprintf((FILE *)this->output,"restore\n");
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw_image_mono(const uchar *data, int ix, int iy, int iw, int ih, int D, int LD) {
  double x = ix, y = iy, w = iw, h = ih;

  fprintf(output,"save\n");

  int i,j, k;

  const char * interpol;
  if (lang_level_>1){
    if (interpolate_)
      interpol="true";
    else
      interpol="false";
    if (mask && lang_level_>2)
      fprintf(output, "%g %g %g %g %i %i %i %i %s GIM\n", x , y+h , w , -h , iw , ih, mx, my, interpol);
    else
      fprintf(output, "%g %g %g %g %i %i %s GII\n", x , y+h , w , -h , iw , ih, interpol);
  }else
    fprintf(output , "%g %g %g %g %i %i GI", x , y+h , w , -h , iw , ih);


  if (!LD) LD = iw*D;


  int bg = (bg_r + bg_g + bg_b)/3;

  uchar *curmask=mask;
  void *big = prepare_rle85();
  for (j=0; j<ih;j++){
    if (mask){
      for (k=0;k<my/ih;k++){
        for (i=0; i<((mx+7)/8);i++){
          write_rle85(swap_byte(*curmask), big);
          curmask++;
        }
      }
    }
    const uchar *curdata=data+j*LD;
    for (i=0 ; i<iw ; i++) {
      uchar r = curdata[0];
      if (lang_level_<3 && D>1) { //can do  mixing

        unsigned int a2 = curdata[1]; //must be int
        unsigned int a = 255-a2;
        r = (a2 * r + bg * a)/255;
      }
      write_rle85(r, big);
      curdata +=D;
    }

  }
  close_rle85(big);
  fprintf(output,"restore\n");
}